

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dense.hpp
# Opt level: O1

void remora::bindings::
     pack_A_triangular<remora::dense_matrix_adaptor<double_const,remora::column_major,remora::dense_tag,remora::cpu_tag>,double,remora::bindings::trmm_block_size<double>,false>
               (long *A,long p)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  undefined8 uVar12;
  
  uVar2 = A[1];
  uVar1 = uVar2 + 3;
  if (3 < uVar1) {
    lVar5 = *A;
    lVar3 = A[3];
    uVar4 = A[2];
    lVar7 = 0;
    uVar8 = 0;
    lVar11 = 0;
    do {
      if (uVar4 != 0) {
        uVar6 = 0;
        lVar9 = lVar5;
        do {
          lVar10 = lVar11;
          lVar11 = 0;
          do {
            uVar12 = 0;
            if ((ulong)(lVar7 + lVar11) <= uVar6 && (ulong)(lVar7 + lVar11) < uVar2) {
              uVar12 = *(undefined8 *)(lVar9 + lVar11 * 8);
            }
            *(undefined8 *)(p + lVar10 * 8 + lVar11 * 8) = uVar12;
            lVar11 = lVar11 + 1;
          } while (lVar11 != 4);
          uVar6 = uVar6 + 1;
          lVar9 = lVar9 + lVar3 * 8;
          lVar11 = lVar10 + 4;
        } while (uVar6 != uVar4);
        lVar11 = lVar10 + 4;
      }
      uVar8 = uVar8 + 1;
      lVar5 = lVar5 + 0x20;
      lVar7 = lVar7 + 4;
    } while (uVar8 != uVar1 >> 2);
  }
  return;
}

Assistant:

size_type size1() const {
		return m_size1;
	}